

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.cc
# Opt level: O2

bool S2ShapeIndexCell::DecodeEdges(int num_edges,S2ClippedShape *clipped,Decoder *decoder)

{
  bool bVar1;
  int iVar2;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint32 delta;
  uint local_40;
  int local_3c;
  Decoder *local_38;
  
  local_3c = 0;
  iVar5 = 0;
  local_38 = decoder;
  while (iVar5 < num_edges) {
    bVar1 = Decoder::get_varint32(local_38,&local_40);
    if (!bVar1) break;
    if (iVar5 + 1 == num_edges) {
      paVar3 = &clipped->field_3;
      if (5 < *(uint *)&clipped->field_0x4) {
        paVar3 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(clipped->field_3).edges_;
      }
      *(uint *)((long)paVar3 + (long)iVar5 * 4) = local_40 + local_3c;
      iVar5 = num_edges;
    }
    else {
      iVar2 = (local_40 & 7) + 1;
      uVar6 = local_40 >> 3;
      local_40 = uVar6;
      if (iVar2 == 8) {
        bVar1 = Decoder::get_varint32(local_38,&local_40);
        if (!bVar1) break;
        iVar2 = uVar6 + 8;
      }
      local_3c = local_40 + local_3c;
      lVar7 = (long)iVar5 << 2;
      for (iVar4 = 0; -iVar2 != iVar4; iVar4 = iVar4 + -1) {
        paVar3 = &clipped->field_3;
        if (5 < *(uint *)&clipped->field_0x4) {
          paVar3 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(clipped->field_3).edges_;
        }
        *(int *)((long)paVar3 + lVar7) = local_3c;
        local_3c = local_3c + 1;
        lVar7 = lVar7 + 4;
      }
      iVar5 = iVar5 - iVar4;
    }
  }
  return num_edges <= iVar5;
}

Assistant:

inline bool S2ShapeIndexCell::DecodeEdges(int num_edges,
                                          S2ClippedShape* clipped,
                                          Decoder* decoder) {
  // This function inverts the encodings documented above.
  int32 edge_id = 0;
  for (int i = 0; i < num_edges; ) {
    uint32 delta;
    if (!decoder->get_varint32(&delta)) return false;
    if (i + 1 == num_edges) {
      // The last edge is encoded without an edge count.
      clipped->set_edge(i++, edge_id + delta);
    } else {
      // Otherwise decode the count and edge delta.
      uint32 count = (delta & 7) + 1;
      delta >>= 3;
      if (count == 8) {
        count = delta + 8;
        if (!decoder->get_varint32(&delta)) return false;
      }
      edge_id += delta;
      for (; count > 0; --count, ++i, ++edge_id) {
        clipped->set_edge(i, edge_id);
      }
    }
  }
  return true;
}